

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O1

void __thiscall
gimage::HighDynamicRangeFusionBase::setContrastWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *wp,ImageFloat *lp,float max_value)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  float ***pppfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  lVar2 = lp->height;
  if (0 < lVar2) {
    uVar1 = lp->depth;
    pfVar5 = **wp->img;
    lVar3 = lp->width;
    lVar6 = 0;
    do {
      if (0 < lVar3) {
        pppfVar4 = lp->img;
        lVar7 = 0;
        do {
          fVar9 = 0.0;
          if (0 < (int)uVar1) {
            uVar8 = 0;
            do {
              fVar9 = fVar9 + pppfVar4[uVar8][lVar6][lVar7];
              uVar8 = uVar8 + 1;
            } while (uVar1 != uVar8);
          }
          fVar10 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar10 = fVar9;
          }
          *pfVar5 = fVar10 * ((1.0 / max_value) / (float)(int)uVar1);
          pfVar5 = pfVar5 + 1;
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar3);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::setContrastWeight(ImageFloat &wp, const ImageFloat &lp,
  float max_value)
{
  float scale=1.0f/max_value/lp.getDepth();

  float *p=wp.getPtr(0, 0, 0);
  for (long k=0; k<lp.getHeight(); k++)
  {
    for (long i=0; i<lp.getWidth(); i++)
    {
      float v=0;
      for (int d=0; d<lp.getDepth(); d++)
      {
        v+=lp.get(i, k, d);
      }

      // use absolute value of laplacian as measure for contrast

      if (v < 0) v=-v;

      *p++ = scale*v;
    }
  }
}